

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xmlparse.c
# Opt level: O0

XML_Error storeEntityValue(XML_Parser parser,ENCODING *enc,char *entityTextPtr,char *entityTextEnd)

{
  undefined1 uVar1;
  undefined1 *puVar2;
  undefined4 uVar3;
  XML_Error XVar4;
  int iVar5;
  int iVar6;
  XML_Char *pXVar7;
  int local_60;
  int n;
  int i;
  XML_Char buf [4];
  ENTITY *entity;
  XML_Char *name;
  XML_Error result;
  int tok;
  char *next;
  STRING_POOL *pool;
  char *entityTextEnd_local;
  char *entityTextPtr_local;
  ENCODING *enc_local;
  XML_Parser parser_local;
  
  next = (char *)((long)parser + 0x330);
  pool = (STRING_POOL *)entityTextEnd;
  entityTextEnd_local = entityTextPtr;
  entityTextPtr_local = (char *)enc;
  enc_local = (ENCODING *)parser;
  do {
    uVar3 = (**(code **)(entityTextPtr_local + 0x28))
                      (entityTextPtr_local,entityTextEnd_local,pool,&result);
    switch(uVar3) {
    case 0:
      if (entityTextPtr_local == *(char **)&enc_local[1].minBytesPerChar) {
        enc_local[3].updatePosition = _result;
      }
      return XML_ERROR_INVALID_TOKEN;
    case 6:
    case 9:
      pXVar7 = poolAppend((STRING_POOL *)next,(ENCODING *)entityTextPtr_local,entityTextEnd_local,
                          (char *)_result);
      if (pXVar7 == (XML_Char *)0x0) {
        return XML_ERROR_NO_MEMORY;
      }
      break;
    case 10:
      iVar5 = (**(code **)(entityTextPtr_local + 0x58))(entityTextPtr_local,entityTextEnd_local);
      if (iVar5 < 0) {
        if (entityTextPtr_local == *(char **)&enc_local[1].minBytesPerChar) {
          enc_local[3].updatePosition =
               (_func_void_ENCODING_ptr_char_ptr_char_ptr_POSITION_ptr *)entityTextEnd_local;
        }
        return XML_ERROR_BAD_CHAR_REF;
      }
      iVar5 = cm_expat_XmlUtf8Encode(iVar5,(char *)&n);
      if (iVar5 == 0) {
        if (entityTextPtr_local == *(char **)&enc_local[1].minBytesPerChar) {
          enc_local[3].updatePosition =
               (_func_void_ENCODING_ptr_char_ptr_char_ptr_POSITION_ptr *)entityTextEnd_local;
        }
        return XML_ERROR_BAD_CHAR_REF;
      }
      for (local_60 = 0; local_60 < iVar5; local_60 = local_60 + 1) {
        if ((*(long *)(next + 0x10) == *(long *)(next + 0x18)) &&
           (iVar6 = poolGrow((STRING_POOL *)next), iVar6 == 0)) {
          return XML_ERROR_NO_MEMORY;
        }
        uVar1 = *(undefined1 *)((long)&n + (long)local_60);
        puVar2 = *(undefined1 **)(next + 0x18);
        *(undefined1 **)(next + 0x18) = puVar2 + 1;
        *puVar2 = uVar1;
      }
      break;
    case 0x1c:
      if ((enc_local[8].scanners[2] == (_func_int_ENCODING_ptr_char_ptr_char_ptr_char_ptr_ptr *)0x0)
         && (entityTextPtr_local == *(char **)&enc_local[1].minBytesPerChar)) {
        enc_local[3].updatePosition =
             (_func_void_ENCODING_ptr_char_ptr_char_ptr_POSITION_ptr *)entityTextEnd_local;
        return XML_ERROR_SYNTAX;
      }
      pXVar7 = poolStoreString((STRING_POOL *)(enc_local[7].literalScanners + 1),
                               (ENCODING *)entityTextPtr_local,
                               entityTextEnd_local + *(int *)(entityTextPtr_local + 0x88),
                               (char *)(_result + -(long)*(int *)(entityTextPtr_local + 0x88)));
      if (pXVar7 == (XML_Char *)0x0) {
        return XML_ERROR_NO_MEMORY;
      }
      _i = lookup((HASH_TABLE *)(enc_local[6].scanners + 1),pXVar7,0);
      enc_local[7].nameLength = (_func_int_ENCODING_ptr_char_ptr *)enc_local[7].skipS;
      if (_i == (NAMED *)0x0) {
        if (entityTextPtr_local == *(char **)&enc_local[1].minBytesPerChar) {
          enc_local[3].updatePosition =
               (_func_void_ENCODING_ptr_char_ptr_char_ptr_POSITION_ptr *)entityTextEnd_local;
        }
        return XML_ERROR_UNDEFINED_ENTITY;
      }
      if (*(char *)&_i[7].name != '\0') {
        if (entityTextPtr_local == *(char **)&enc_local[1].minBytesPerChar) {
          enc_local[3].updatePosition =
               (_func_void_ENCODING_ptr_char_ptr_char_ptr_POSITION_ptr *)entityTextEnd_local;
        }
        return XML_ERROR_RECURSIVE_ENTITY_REF;
      }
      if (_i[3].name != (KEY)0x0) {
        if (entityTextPtr_local == *(char **)&enc_local[1].minBytesPerChar) {
          enc_local[3].updatePosition =
               (_func_void_ENCODING_ptr_char_ptr_char_ptr_POSITION_ptr *)entityTextEnd_local;
        }
        return XML_ERROR_PARAM_ENTITY_REF;
      }
      *(undefined1 *)&_i[7].name = 1;
      XVar4 = storeEntityValue(enc_local,(ENCODING *)enc_local[3].scanners[1],_i[1].name,
                               _i[1].name + *(int *)&_i[2].name);
      *(undefined1 *)&_i[7].name = 0;
      if (XVar4 != XML_ERROR_NONE) {
        return XVar4;
      }
      break;
    case 0xfffffffc:
      return XML_ERROR_NONE;
    case 0xfffffffd:
      _result = (_func_void_ENCODING_ptr_char_ptr_char_ptr_POSITION_ptr *)
                (entityTextEnd_local + *(int *)(entityTextPtr_local + 0x88));
    case 7:
      if ((*(long *)(next + 0x10) == *(long *)(next + 0x18)) &&
         (iVar5 = poolGrow((STRING_POOL *)next), iVar5 == 0)) {
        return XML_ERROR_NO_MEMORY;
      }
      puVar2 = *(undefined1 **)(next + 0x18);
      *(undefined1 **)(next + 0x18) = puVar2 + 1;
      *puVar2 = 10;
      break;
    default:
      if (entityTextPtr_local == *(char **)&enc_local[1].minBytesPerChar) {
        enc_local[3].updatePosition =
             (_func_void_ENCODING_ptr_char_ptr_char_ptr_POSITION_ptr *)entityTextEnd_local;
      }
      return XML_ERROR_UNEXPECTED_STATE;
    case 0xffffffff:
      if (entityTextPtr_local == *(char **)&enc_local[1].minBytesPerChar) {
        enc_local[3].updatePosition =
             (_func_void_ENCODING_ptr_char_ptr_char_ptr_POSITION_ptr *)entityTextEnd_local;
      }
      return XML_ERROR_INVALID_TOKEN;
    }
    entityTextEnd_local = (char *)_result;
  } while( true );
}

Assistant:

static
enum XML_Error storeEntityValue(XML_Parser parser,
                                const ENCODING *enc,
                                const char *entityTextPtr,
                                const char *entityTextEnd)
{
  STRING_POOL *pool = &(dtd.pool);
  for (;;) {
    const char *next;
    int tok = XmlEntityValueTok(enc, entityTextPtr, entityTextEnd, &next);
    switch (tok) {
    case XML_TOK_PARAM_ENTITY_REF:
#ifdef XML_DTD
      if (parentParser || enc != encoding) {
        enum XML_Error result;
        const XML_Char *name;
        ENTITY *entity;
        name = poolStoreString(&tempPool, enc,
                               entityTextPtr + enc->minBytesPerChar,
                               next - enc->minBytesPerChar);
        if (!name)
          return XML_ERROR_NO_MEMORY;
        entity = (ENTITY *)lookup(&dtd.paramEntities, name, 0);
        poolDiscard(&tempPool);
        if (!entity) {
          if (enc == encoding)
            eventPtr = entityTextPtr;
          return XML_ERROR_UNDEFINED_ENTITY;
        }
        if (entity->open) {
          if (enc == encoding)
            eventPtr = entityTextPtr;
          return XML_ERROR_RECURSIVE_ENTITY_REF;
        }
        if (entity->systemId) {
          if (enc == encoding)
            eventPtr = entityTextPtr;
          return XML_ERROR_PARAM_ENTITY_REF;
        }
        entity->open = 1;
        result = storeEntityValue(parser,
                                  internalEncoding,
                                  (char *)entity->textPtr,
                                  (char *)(entity->textPtr + entity->textLen));
        entity->open = 0;
        if (result)
          return result;
        break;
      }
#endif /* XML_DTD */
      eventPtr = entityTextPtr;
      return XML_ERROR_SYNTAX;
    case XML_TOK_NONE:
      return XML_ERROR_NONE;
    case XML_TOK_ENTITY_REF:
    case XML_TOK_DATA_CHARS:
      if (!poolAppend(pool, enc, entityTextPtr, next))
        return XML_ERROR_NO_MEMORY;
      break;
    case XML_TOK_TRAILING_CR:
      next = entityTextPtr + enc->minBytesPerChar;
      /* fall through */
    case XML_TOK_DATA_NEWLINE:
      if (pool->end == pool->ptr && !poolGrow(pool))
        return XML_ERROR_NO_MEMORY;
      *(pool->ptr)++ = 0xA;
      break;
    case XML_TOK_CHAR_REF:
      {
        XML_Char buf[XML_ENCODE_MAX];
        int i;
        int n = XmlCharRefNumber(enc, entityTextPtr);
        if (n < 0) {
          if (enc == encoding)
            eventPtr = entityTextPtr;
          return XML_ERROR_BAD_CHAR_REF;
        }
        n = XmlEncode(n, (ICHAR *)buf);
        if (!n) {
          if (enc == encoding)
            eventPtr = entityTextPtr;
          return XML_ERROR_BAD_CHAR_REF;
        }
        for (i = 0; i < n; i++) {
          if (pool->end == pool->ptr && !poolGrow(pool))
            return XML_ERROR_NO_MEMORY;
          *(pool->ptr)++ = buf[i];
        }
      }
      break;
    case XML_TOK_PARTIAL:
      if (enc == encoding)
        eventPtr = entityTextPtr;
      return XML_ERROR_INVALID_TOKEN;
    case XML_TOK_INVALID:
      if (enc == encoding)
        eventPtr = next;
      return XML_ERROR_INVALID_TOKEN;
    default:
      if (enc == encoding)
        eventPtr = entityTextPtr;
      return XML_ERROR_UNEXPECTED_STATE;
    }
    entityTextPtr = next;
  }
  /* not reached */
}